

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

bool __thiscall
Clasp::Asp::LogicProgram::pushHead
          (LogicProgram *this,Head_t ht,AtomSpan *head,weight_t slack,RuleBuilder *out)

{
  AtomState *this_00;
  byte *pbVar1;
  uint *puVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  Body_t BVar7;
  WeightLit_t *pWVar8;
  WeightLit_t *pWVar9;
  Atom_t *pAVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  long lVar14;
  uint a;
  uint uVar15;
  
  BVar7 = Potassco::RuleBuilder::bodyType(out);
  Potassco::RuleBuilder::start(out,ht);
  puVar2 = head->first;
  sVar3 = head->size;
  this_00 = &this->atomState_;
  lVar14 = 0;
  bVar4 = false;
  uVar15 = 0;
  do {
    if (sVar3 << 2 == lVar14) {
      pAVar10 = Potassco::RuleBuilder::head_begin(out);
      for (lVar14 = 0; (ulong)uVar15 << 2 != lVar14; lVar14 = lVar14 + 4) {
        if (*(uint *)((long)pAVar10 + lVar14) < (this->atomState_).state_.ebo_.size) {
          pbVar1 = (this_00->state_).ebo_.buf + *(uint *)((long)pAVar10 + lVar14);
          *pbVar1 = *pbVar1 & 0xe0;
        }
      }
      return !bVar4 || uVar15 != 0 && ht.val_ == Choice;
    }
    a = *(uint *)((long)puVar2 + lVar14);
    if ((a < (this->atomState_).state_.ebo_.size) &&
       (bVar11 = (this_00->state_).ebo_.buf[a], (bVar11 & 0x7f) != 0)) {
      if ((bVar11 & 0x44) == 0) {
        bVar5 = AtomState::inBody(this_00,(Literal)(a << 2));
        bVar6 = AtomState::inBody(this_00,(Literal)(*(int *)((long)puVar2 + lVar14) * 4 + 2));
        uVar13 = (uint)bVar5;
        if ((BVar7.val_ == Sum) && (bVar5)) {
          pWVar8 = Potassco::RuleBuilder::wlits_begin(out);
          pWVar9 = Potassco::RuleBuilder::wlits_end(out);
          pWVar8 = std::
                   __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                             (pWVar8,pWVar9,*(undefined4 *)((long)puVar2 + lVar14));
          uVar13 = pWVar8->weight;
        }
        uVar12 = (uint)bVar6;
        if ((BVar7.val_ == Sum) && (bVar6)) {
          pWVar8 = Potassco::RuleBuilder::wlits_begin(out);
          pWVar9 = Potassco::RuleBuilder::wlits_end(out);
          pWVar8 = std::
                   __find_if<Potassco::WeightLit_t*,__gnu_cxx::__ops::_Iter_pred<Clasp::Asp::IsLit>>
                             (pWVar8,pWVar9,-*(int *)((long)puVar2 + lVar14));
          uVar12 = pWVar8->weight;
        }
        a = *(uint *)((long)puVar2 + lVar14);
        if (a < (this->atomState_).state_.ebo_.size) {
          bVar11 = ((this_00->state_).ebo_.buf[a] & 0x20) >> 5;
        }
        else {
          bVar11 = 0;
        }
        if ((bVar11 == 0) && ((int)uVar13 <= slack)) {
          if ((int)uVar12 <= slack) goto LAB_0013d413;
        }
        else {
          bVar4 = true;
        }
      }
    }
    else {
LAB_0013d413:
      Potassco::RuleBuilder::addHead(out,a);
      AtomState::addToHead(this_00,*(Atom_t *)((long)puVar2 + lVar14));
      uVar15 = uVar15 + 1;
    }
    lVar14 = lVar14 + 4;
  } while( true );
}

Assistant:

bool LogicProgram::pushHead(Head_t ht, const Potassco::AtomSpan& head, weight_t slack, RuleBuilder& out) {
	const uint8 ignoreMask = AtomState::false_flag|AtomState::head_flag;
	uint32 hs = 0;
	bool sat = false, sum = out.bodyType() == Body_t::Sum;
	out.start(ht);
	for (Potassco::AtomSpan::iterator it = Potassco::begin(head), end = Potassco::end(head); it != end; ++it) {
		if (!atomState_.isSet(*it, AtomState::simp_mask)) {
			out.addHead(*it);
			atomState_.addToHead(*it);
			++hs;
		}
		else if (!atomState_.isSet(*it, ignoreMask)) { // h occurs in B+ and/or B- or is true
			weight_t wp = weight_t(atomState_.inBody(posLit(*it))), wn = weight_t(atomState_.inBody(negLit(*it)));
			if (wp && sum) { wp = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::lit(*it)))->weight; }
			if (wn && sum) { wn = std::find_if(out.wlits_begin(), out.wlits_end(), IsLit(Potassco::neg(*it)))->weight; }
			if (atomState_.isFact(*it) || wp > slack) { sat = true; }
			else if (wn <= slack) {
				out.addHead(*it);
				atomState_.addToHead(*it);
				++hs;
			}
		}
	}
	for (const Atom_t* it = out.head_begin(), *end = it + hs; it != end; ++it) {
		atomState_.clearRule(*it);
	}
	return !sat || (ht == Head_t::Choice && hs);
}